

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
xLearn::LibsvmParser::Parse(LibsvmParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  byte bVar2;
  index_t iVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  index_t row_id;
  DMatrix *this_00;
  Parser *this_01;
  uint64 pos;
  float feat_val;
  double dVar7;
  float local_9c;
  Logger local_98;
  float local_94;
  char *local_90;
  string local_88;
  string local_68;
  uint64 local_48;
  uint64 local_40;
  uint64 local_38;
  
  local_90 = buf;
  if (buf == (char *)0x0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_98.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Parse","");
    poVar6 = Logger::Start(ERR,&local_68,0x4c,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"buf",3);
    std::operator<<(poVar6," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      local_38 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_90,0,size);
      if (local_38 != 0) {
        pos = 0;
        local_48 = size;
        do {
          local_40 = pos;
          DMatrix::AddRow(matrix);
          bVar2 = (this->super_Parser).has_label_;
          row_id = matrix->row_length - 1;
          if ((bool)bVar2 == true) {
            pcVar4 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
            dVar7 = atof(pcVar4);
            (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(int)row_id] = (float)dVar7;
            bVar2 = (this->super_Parser).has_label_;
          }
          else {
            (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(int)row_id] = -2.0;
          }
          local_9c = 0.0;
          if ((bVar2 & 1) == 0) {
            pcVar4 = strtok(line_buf,":");
            pcVar5 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\n')) {
              iVar3 = atoi(pcVar4);
              dVar7 = atof(pcVar5);
              feat_val = (float)dVar7;
              DMatrix::AddNode(matrix,row_id,iVar3,feat_val,0);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)feat_val),ZEXT416((uint)feat_val),ZEXT416(0));
              local_9c = auVar1._0_4_;
            }
          }
          pcVar4 = strtok((char *)0x0,":");
          this_01 = (Parser *)0x0;
          pcVar5 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          while ((pcVar4 != (char *)0x0 && (*pcVar4 != '\n'))) {
            iVar3 = atoi(pcVar4);
            dVar7 = atof(pcVar5);
            local_94 = (float)dVar7;
            DMatrix::AddNode(matrix,row_id,iVar3,local_94,0);
            auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_9c),ZEXT416((uint)local_94),
                                     ZEXT416((uint)local_94));
            local_9c = auVar1._0_4_;
            pcVar4 = strtok((char *)0x0,":");
            this_01 = (Parser *)0x0;
            pcVar5 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          }
          pos = local_40 + local_38;
          (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(int)row_id] = 1.0 / local_9c;
          local_38 = Parser::get_line_from_buffer(this_01,line_buf,local_90,pos,local_48);
        } while (local_38 != 0);
      }
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_98.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Parse","");
    poVar6 = Logger::Start(ERR,&local_68,0x4d,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"size",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
    std::operator<<(poVar6,"\n");
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  Logger::~Logger(&local_98);
  abort();
}

Assistant:

void LibsvmParser::Parse(char* buf, 
                         uint64 size, 
                         DMatrix& matrix, 
                         bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    if (reset == false) {
    }
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *idx_char = strtok(line_buf, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        matrix.AddNode(i, idx, value);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char == nullptr || *idx_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}